

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::PipelineClassifier::_InternalSerialize
          (PipelineClassifier *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint value;
  Pipeline *this_00;
  ulong uVar1;
  void *data;
  uint8_t *puVar2;
  undefined8 *puVar3;
  size_t __n;
  
  if ((this != (PipelineClassifier *)_PipelineClassifier_default_instance_) &&
     (this->pipeline_ != (Pipeline *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->pipeline_;
    *target = '\n';
    value = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)value;
    if (value < 0x80) {
      puVar2 = target + 2;
    }
    else {
      puVar2 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (value,target + 1);
    }
    target = Pipeline::_InternalSerialize(this_00,puVar2,stream);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    data = *(void **)((uVar1 & 0xfffffffffffffffc) + 8);
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar1 & 1) == 0) {
      puVar3 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar3 = (undefined8 *)((uVar1 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar3[1];
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar3[1],target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* PipelineClassifier::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.PipelineClassifier)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pipeline pipeline = 1;
  if (this->_internal_has_pipeline()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::pipeline(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.PipelineClassifier)
  return target;
}